

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  ulong uVar5;
  int64_t *piVar6;
  ulong uVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  secp256k1_modinv64_signed62 *a;
  secp256k1_modinv64_signed62 *a_00;
  secp256k1_modinv64_signed62 *psVar11;
  long lVar12;
  secp256k1_modinv64_signed62 *a_01;
  int64_t *piVar13;
  long lVar14;
  ulong uVar15;
  secp256k1_modinv64_signed62 *psVar16;
  secp256k1_modinv64_signed62 *psVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int64_t *piVar21;
  ulong uVar22;
  secp256k1_modinv64_signed62 *psVar23;
  secp256k1_modinv64_signed62 *psVar24;
  ulong uVar25;
  secp256k1_modinv64_signed62 *unaff_R15;
  ulong uVar26;
  bool bVar27;
  secp256k1_modinv64_signed62 sStack_110;
  secp256k1_modinv64_signed62 sStack_e8;
  secp256k1_modinv64_signed62 *psStack_c0;
  secp256k1_modinv64_signed62 *psStack_b8;
  secp256k1_modinv64_signed62 *psStack_b0;
  ulong local_a8;
  secp256k1_modinv64_signed62 *local_a0;
  ulong local_98;
  secp256k1_modinv64_signed62 *local_90;
  secp256k1_modinv64_signed62 *local_88;
  secp256k1_modinv64_signed62 *local_80;
  int64_t local_78;
  int64_t local_70;
  secp256k1_modinv64_signed62 *local_68;
  secp256k1_modinv64_signed62 *local_60;
  int64_t local_58;
  int64_t local_50;
  secp256k1_modinv64_signed62 *local_48;
  secp256k1_modinv64_signed62 *local_40;
  int64_t local_38;
  
  lVar12 = d->v[0];
  local_40 = (secp256k1_modinv64_signed62 *)d->v[1];
  local_50 = d->v[2];
  local_58 = d->v[3];
  local_78 = d->v[4];
  psVar24 = (secp256k1_modinv64_signed62 *)e->v[0];
  local_38 = e->v[1];
  local_60 = (secp256k1_modinv64_signed62 *)e->v[2];
  local_48 = (secp256k1_modinv64_signed62 *)e->v[3];
  local_98 = t->u;
  local_90 = (secp256k1_modinv64_signed62 *)t->v;
  local_a8 = t->q;
  local_a0 = (secp256k1_modinv64_signed62 *)t->r;
  local_70 = e->v[4];
  psVar11 = (secp256k1_modinv64_signed62 *)0x5;
  uVar8 = 0xfffffffffffffffe;
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x1185ea;
  a_01 = d;
  iVar2 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,-2);
  a_00 = d;
  if (iVar2 < 1) {
LAB_00118e84:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118e89;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_00118e89:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118e8e;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_00118e8e:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118e93;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_00118e93:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118e98;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_00118e98:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118e9d;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_00118e9d:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118ea2;
    secp256k1_modinv64_update_de_62_cold_23();
LAB_00118ea2:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118ea7;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_00118ea7:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118eac;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_00118eac:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118eb1;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_00118eb1:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118eb6;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00118eb6:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118ebb;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_00118ebb:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118ec0;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00118ec0:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118ec5;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00118ec5:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118eca;
    secp256k1_modinv64_update_de_62_cold_5();
LAB_00118eca:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118ecf;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_00118ecf:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118ed4;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00118ed4:
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118ed9;
    secp256k1_modinv64_update_de_62_cold_22();
  }
  else {
    uVar8 = 1;
    psVar11 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x11860b;
    a_01 = d;
    iVar2 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar2) goto LAB_00118e89;
    psVar11 = (secp256k1_modinv64_signed62 *)0x5;
    uVar8 = 0xfffffffffffffffe;
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x11862e;
    a_01 = e;
    iVar2 = secp256k1_modinv64_mul_cmp_62(e,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar2 < 1) goto LAB_00118e8e;
    uVar8 = 1;
    psVar11 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x11864f;
    a_01 = e;
    iVar2 = secp256k1_modinv64_mul_cmp_62(e,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar2) goto LAB_00118e93;
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x11866b;
    unaff_R15 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(local_98);
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118678;
    a_01 = local_90;
    iVar4 = secp256k1_modinv64_abs((int64_t)local_90);
    uVar8 = 0x4000000000000000 - iVar4;
    if ((long)uVar8 < (long)unaff_R15) goto LAB_00118e98;
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x118693;
    unaff_R15 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(local_a8);
    psStack_b0 = (secp256k1_modinv64_signed62 *)0x1186a0;
    a_01 = local_a0;
    iVar4 = secp256k1_modinv64_abs((int64_t)local_a0);
    uVar8 = 0x4000000000000000 - iVar4;
    if ((long)uVar8 < (long)unaff_R15) goto LAB_00118e9d;
    psVar11 = (secp256k1_modinv64_signed62 *)(local_98 * lVar12);
    uVar8 = SUB168(SEXT816((long)local_98) * SEXT816(lVar12),8);
    uVar5 = (long)local_90 * (long)psVar24;
    lVar9 = SUB168(SEXT816((long)local_90) * SEXT816((long)psVar24),8);
    a_00 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    a_01 = (secp256k1_modinv64_signed62 *)~uVar5;
    lVar10 = (0x7fffffffffffffff - lVar9) - uVar8;
    local_80 = d;
    if ((SBORROW8(0x7fffffffffffffff - lVar9,uVar8) != SBORROW8(lVar10,(ulong)(a_01 < psVar11))) !=
        (long)(lVar10 - (ulong)(a_01 < psVar11)) < 0 && -1 < lVar9) goto LAB_00118ed4;
    piVar6 = (int64_t *)((long)psVar11->v + uVar5);
    psVar16 = (secp256k1_modinv64_signed62 *)(lVar9 + uVar8 + (ulong)CARRY8(uVar5,(ulong)psVar11));
    unaff_R15 = (secp256k1_modinv64_signed62 *)(local_a8 * lVar12);
    lVar10 = SUB168(SEXT816((long)local_a8) * SEXT816(lVar12),8);
    uVar5 = (long)local_a0 * (long)psVar24;
    a_01 = SUB168(SEXT816((long)local_a0) * SEXT816((long)psVar24),8);
    uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar5 - 1) < unaff_R15);
    lVar12 = (0x7fffffffffffffff - (long)a_01) - lVar10;
    bVar27 = (SBORROW8(0x7fffffffffffffff - (long)a_01,lVar10) != SBORROW8(lVar12,uVar8)) !=
             (long)(lVar12 - uVar8) < 0;
    uVar8 = CONCAT71((int7)(-uVar5 - 1 >> 8),bVar27 && -1 < (long)a_01);
    if (!bVar27 || -1 >= (long)a_01) {
      piVar21 = (int64_t *)(local_78 >> 0x3f);
      uVar8 = local_70 >> 0x3f;
      lVar12 = ((ulong)local_90 & uVar8) + (local_98 & (ulong)piVar21);
      psVar24 = (secp256k1_modinv64_signed62 *)0xfffffffefffffc2f;
      piVar13 = (int64_t *)((long)unaff_R15->v + uVar5);
      a_01 = (secp256k1_modinv64_signed62 *)
             ((long)a_01->v + (ulong)CARRY8(uVar5,(ulong)unaff_R15) + lVar10);
      uVar5 = 0x27c7f6e22ddacacf;
      psVar11 = (secp256k1_modinv64_signed62 *)
                (lVar12 - ((long)piVar6 * 0x27c7f6e22ddacacf + lVar12 & 0x3fffffffffffffffU));
      unaff_R15 = (secp256k1_modinv64_signed62 *)((long)psVar11 * -0x1000003d1);
      iVar4 = SUB168(SEXT816((long)psVar11) * SEXT816(-0x1000003d1),8);
      local_88 = e;
      if (0 < (long)psVar11) {
        lVar10 = (-0x8000000000000000 - iVar4) -
                 (ulong)(unaff_R15 != (secp256k1_modinv64_signed62 *)0x0);
        uVar7 = (ulong)(piVar6 < (undefined1 *)((long)psVar11 * 0x1000003d1));
        lVar12 = (long)psVar16 - lVar10;
        if ((SBORROW8((long)psVar16,lVar10) != SBORROW8(lVar12,uVar7)) == (long)(lVar12 - uVar7) < 0
           ) goto LAB_001187d9;
LAB_00118933:
        psStack_b0 = (secp256k1_modinv64_signed62 *)0x118938;
        secp256k1_modinv64_update_de_62_cold_20();
LAB_00118938:
        uVar7 = (ulong)((undefined1 *)(-(long)piVar6 - 1U) < piVar13);
        lVar12 = (0x7fffffffffffffff - (long)psVar24) - (long)a_01;
        psVar17 = psVar16;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar24,(long)a_01) != SBORROW8(lVar12,uVar7)) !=
            (long)(lVar12 - uVar7) < 0) goto LAB_00118954;
LAB_00118848:
        bVar27 = CARRY8((ulong)piVar6,(ulong)piVar13);
        piVar6 = (int64_t *)((long)piVar13 + (long)piVar6);
        psVar24 = (secp256k1_modinv64_signed62 *)((long)a_01->v + (ulong)bVar27 + (long)psVar24->v);
        if (((ulong)unaff_R15 & 0x3fffffffffffffff) != 0) goto LAB_00118ea2;
        if (((ulong)piVar6 & 0x3fffffffffffffff) == 0) {
          unaff_R15 = (secp256k1_modinv64_signed62 *)((ulong)unaff_R15 >> 0x3e | iVar4 << 2);
          piVar21 = (int64_t *)((long)unaff_R15->v + local_98 * (long)local_40);
          uVar5 = SUB168(SEXT816((long)local_98) * SEXT816((long)local_40),8) + (iVar4 >> 0x3e) +
                  (ulong)CARRY8(local_98 * (long)local_40,(ulong)unaff_R15);
          uVar7 = (long)local_90 * local_38;
          lVar12 = SUB168(SEXT816((long)local_90) * SEXT816(local_38),8);
          psVar16 = local_40;
          iVar4 = local_38;
          local_68 = psVar17;
          if (lVar12 < 0) goto LAB_00118959;
          uVar19 = (ulong)((undefined1 *)(-1 - uVar7) < piVar21);
          lVar10 = (0x7fffffffffffffff - lVar12) - uVar5;
          if ((SBORROW8(0x7fffffffffffffff - lVar12,uVar5) != SBORROW8(lVar10,uVar19)) ==
              (long)(lVar10 - uVar19) < 0) goto LAB_001188c9;
          goto LAB_0011897b;
        }
        goto LAB_00118ea7;
      }
      uVar7 = (ulong)((undefined1 *)((long)psVar11 * 0x1000003d1 - 1U) < piVar6);
      lVar12 = (0x7fffffffffffffff - iVar4) - (long)psVar16;
      if ((SBORROW8(0x7fffffffffffffff - iVar4,(long)psVar16) != SBORROW8(lVar12,uVar7)) !=
          (long)(lVar12 - uVar7) < 0) goto LAB_00118933;
LAB_001187d9:
      lVar12 = (uVar8 & (ulong)local_a0) + ((ulong)piVar21 & local_a8);
      uVar5 = (long)piVar13 * 0x27c7f6e22ddacacf + lVar12 & 0x3fffffffffffffff;
      uVar8 = lVar12 - uVar5;
      bVar27 = CARRY8((ulong)unaff_R15,(ulong)piVar6);
      unaff_R15 = (secp256k1_modinv64_signed62 *)((long)piVar6 + (long)unaff_R15->v);
      iVar4 = (long)psVar16->v + (ulong)bVar27 + iVar4;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar8;
      piVar6 = SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),0);
      psVar16 = (secp256k1_modinv64_signed62 *)((long)uVar8 >> 0x3f);
      piVar21 = (int64_t *)(SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),8) - uVar8);
      psVar24 = (secp256k1_modinv64_signed62 *)((long)psVar16 * -0x1000003d1 + (long)piVar21);
      if ((long)uVar8 < 1) goto LAB_00118938;
      lVar10 = (-0x8000000000000000 - (long)psVar24) - (ulong)(piVar6 != (int64_t *)0x0);
      lVar12 = (long)a_01 - lVar10;
      psVar17 = psVar16;
      if ((SBORROW8((long)a_01,lVar10) !=
          SBORROW8(lVar12,(ulong)(piVar13 < (undefined1 *)-(long)piVar6))) ==
          (long)(lVar12 - (ulong)(piVar13 < (undefined1 *)-(long)piVar6)) < 0) goto LAB_00118848;
LAB_00118954:
      psStack_b0 = (secp256k1_modinv64_signed62 *)0x118959;
      secp256k1_modinv64_update_de_62_cold_19();
      uVar7 = extraout_RAX;
      lVar12 = extraout_RDX;
LAB_00118959:
      lVar9 = (-0x8000000000000000 - lVar12) - (ulong)(uVar7 != 0);
      lVar10 = uVar5 - lVar9;
      if ((SBORROW8(uVar5,lVar9) != SBORROW8(lVar10,(ulong)(piVar21 < (undefined1 *)-uVar7))) ==
          (long)(lVar10 - (ulong)(piVar21 < (undefined1 *)-uVar7)) < 0) {
LAB_001188c9:
        uVar19 = (ulong)piVar6 >> 0x3e | (long)psVar24 << 2;
        bVar27 = CARRY8((ulong)piVar21,uVar7);
        piVar21 = (int64_t *)((long)piVar21 + uVar7);
        uVar5 = uVar5 + lVar12 + (ulong)bVar27;
        unaff_R15 = (secp256k1_modinv64_signed62 *)(local_a8 * (long)psVar16 + uVar19);
        psVar16 = (secp256k1_modinv64_signed62 *)
                  (SUB168(SEXT816((long)local_a8) * SEXT816((long)psVar16),8) +
                   ((long)psVar24 >> 0x3e) + (ulong)CARRY8(local_a8 * (long)psVar16,uVar19));
        uVar7 = (long)local_a0 * iVar4;
        lVar12 = SUB168(SEXT816((long)local_a0) * SEXT816(iVar4),8);
        if (lVar12 < 0) goto LAB_00118980;
        a_01 = (secp256k1_modinv64_signed62 *)(-1 - uVar7);
        lVar10 = (0x7fffffffffffffff - lVar12) - (long)psVar16;
        bVar27 = SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar16) !=
                 SBORROW8(lVar10,(ulong)(a_01 < unaff_R15));
        psVar17 = (secp256k1_modinv64_signed62 *)(lVar10 - (ulong)(a_01 < unaff_R15));
      }
      else {
LAB_0011897b:
        psStack_b0 = (secp256k1_modinv64_signed62 *)0x118980;
        secp256k1_modinv64_update_de_62_cold_18();
        uVar7 = extraout_RAX_00;
        lVar12 = extraout_RDX_00;
LAB_00118980:
        lVar9 = (-0x8000000000000000 - lVar12) - (ulong)(uVar7 != 0);
        lVar10 = (long)psVar16 - lVar9;
        bVar27 = SBORROW8((long)psVar16,lVar9) !=
                 SBORROW8(lVar10,(ulong)(unaff_R15 < (secp256k1_modinv64_signed62 *)-uVar7));
        a_01 = (secp256k1_modinv64_signed62 *)
               (lVar10 - (ulong)(unaff_R15 < (secp256k1_modinv64_signed62 *)-uVar7));
        psVar17 = a_01;
      }
      psVar24 = local_60;
      psVar23 = local_88;
      if (bVar27 != (long)psVar17 < 0) goto LAB_00118eac;
      uVar26 = (long)unaff_R15->v + uVar7;
      lVar9 = (long)psVar16->v + (ulong)CARRY8((ulong)unaff_R15,uVar7) + lVar12;
      uVar19 = uVar5 << 2 | (ulong)piVar21 >> 0x3e;
      uVar22 = (ulong)piVar21 & 0x3fffffffffffffff;
      uVar7 = local_98 * local_50 + uVar19;
      lVar10 = SUB168(SEXT816((long)local_98) * SEXT816(local_50),8) + ((long)uVar5 >> 0x3e) +
               (ulong)CARRY8(local_98 * local_50,uVar19);
      local_80->v[0] = uVar22;
      uVar5 = (long)local_90 * (long)local_60;
      lVar12 = SUB168(SEXT816((long)local_90) * SEXT816((long)local_60),8);
      local_88->v[0] = uVar26 & 0x3fffffffffffffff;
      if (lVar12 < 0) {
        lVar20 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        if ((SBORROW8(lVar10,lVar20) != SBORROW8(lVar10 - lVar20,(ulong)(uVar7 < -uVar5))) !=
            (long)((lVar10 - lVar20) - (ulong)(uVar7 < -uVar5)) < 0) goto LAB_00118c18;
LAB_00118a16:
        uVar26 = uVar26 >> 0x3e | lVar9 * 4;
        bVar27 = CARRY8(uVar7,uVar5);
        uVar7 = uVar7 + uVar5;
        lVar10 = lVar10 + lVar12 + (ulong)bVar27;
        uVar22 = local_a8 * local_50 + uVar26;
        lVar20 = SUB168(SEXT816((long)local_a8) * SEXT816(local_50),8) + (lVar9 >> 0x3e) +
                 (ulong)CARRY8(local_a8 * local_50,uVar26);
        uVar5 = (long)local_a0 * (long)local_60;
        lVar12 = SUB168(SEXT816((long)local_a0) * SEXT816((long)local_60),8);
        if (lVar12 < 0) goto LAB_00118c1d;
        uVar19 = -uVar5 - 1;
        lVar14 = (0x7fffffffffffffff - lVar12) - lVar20;
        lVar9 = lVar14 - (ulong)(uVar19 < uVar22);
        if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar20) !=
            SBORROW8(lVar14,(ulong)(uVar19 < uVar22))) != lVar9 < 0) goto LAB_00118c3f;
LAB_00118a67:
        bVar27 = CARRY8(uVar22,uVar5);
        uVar22 = uVar22 + uVar5;
        lVar20 = lVar20 + lVar12 + (ulong)bVar27;
        uVar5 = lVar10 << 2 | uVar7 >> 0x3e;
        uVar26 = uVar22 & 0x3fffffffffffffff;
        uVar19 = local_98 * local_58 + uVar5;
        lVar9 = SUB168(SEXT816((long)local_98) * SEXT816(local_58),8) + (lVar10 >> 0x3e) +
                (ulong)CARRY8(local_98 * local_58,uVar5);
        local_80->v[1] = uVar7 & 0x3fffffffffffffff;
        uVar5 = (long)local_90 * (long)local_48;
        lVar12 = SUB168(SEXT816((long)local_90) * SEXT816((long)local_48),8);
        psVar23->v[1] = uVar26;
        psVar24 = local_48;
        if (lVar12 < 0) goto LAB_00118c44;
        uVar7 = (ulong)(-uVar5 - 1 < uVar19);
        lVar10 = (0x7fffffffffffffff - lVar12) - lVar9;
        if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar9) != SBORROW8(lVar10,uVar7)) !=
            (long)(lVar10 - uVar7) < 0) goto LAB_00118c66;
LAB_00118ad7:
        uVar7 = uVar22 >> 0x3e | lVar20 << 2;
        bVar27 = CARRY8(uVar19,uVar5);
        uVar19 = uVar19 + uVar5;
        lVar9 = lVar9 + lVar12 + (ulong)bVar27;
        psVar23 = (secp256k1_modinv64_signed62 *)(local_a8 * local_58 + uVar7);
        uVar26 = SUB168(SEXT816((long)local_a8) * SEXT816(local_58),8) + (lVar20 >> 0x3e) +
                 (ulong)CARRY8(local_a8 * local_58,uVar7);
        uVar5 = (long)local_a0 * (long)psVar24;
        lVar12 = SUB168(SEXT816((long)local_a0) * SEXT816((long)psVar24),8);
        if (lVar12 < 0) goto LAB_00118c6b;
        a_01 = (secp256k1_modinv64_signed62 *)(-1 - uVar5);
        lVar10 = (0x7fffffffffffffff - lVar12) - uVar26;
        uVar7 = lVar10 - (ulong)(a_01 < psVar23);
        if ((SBORROW8(0x7fffffffffffffff - lVar12,uVar26) !=
            SBORROW8(lVar10,(ulong)(a_01 < psVar23))) == (long)uVar7 < 0) goto LAB_00118b32;
LAB_00118c90:
        psStack_b0 = (secp256k1_modinv64_signed62 *)0x118c95;
        secp256k1_modinv64_update_de_62_cold_13();
        uVar5 = extraout_RAX_04;
        lVar12 = extraout_RDX_04;
LAB_00118c95:
        lVar9 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        uVar19 = ((long)a_01 - lVar9) - (ulong)(uVar7 < -uVar5);
        if ((SBORROW8((long)a_01,lVar9) != SBORROW8((long)a_01 - lVar9,(ulong)(uVar7 < -uVar5))) ==
            (long)uVar19 < 0) goto LAB_00118ba4;
LAB_00118cb0:
        psStack_b0 = (secp256k1_modinv64_signed62 *)0x118cb5;
        secp256k1_modinv64_update_de_62_cold_12();
        uVar5 = extraout_RAX_05;
        lVar12 = extraout_RDX_05;
LAB_00118cb5:
        lVar20 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        lVar10 = lVar9 - lVar20;
        bVar27 = SBORROW8(lVar9,lVar20) != SBORROW8(lVar10,(ulong)(uVar19 < -uVar5));
        lVar10 = lVar10 - (ulong)(uVar19 < -uVar5);
      }
      else {
        uVar19 = (ulong)(-uVar5 - 1 < uVar7);
        lVar14 = (0x7fffffffffffffff - lVar12) - lVar10;
        lVar20 = lVar14 - uVar19;
        if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar10) != SBORROW8(lVar14,uVar19)) == lVar20 < 0)
        goto LAB_00118a16;
LAB_00118c18:
        psStack_b0 = (secp256k1_modinv64_signed62 *)0x118c1d;
        secp256k1_modinv64_update_de_62_cold_16();
        uVar5 = extraout_RAX_01;
        lVar12 = extraout_RDX_01;
LAB_00118c1d:
        lVar9 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        uVar19 = (lVar20 - lVar9) - (ulong)(uVar22 < -uVar5);
        if ((SBORROW8(lVar20,lVar9) != SBORROW8(lVar20 - lVar9,(ulong)(uVar22 < -uVar5))) ==
            (long)uVar19 < 0) goto LAB_00118a67;
LAB_00118c3f:
        psStack_b0 = (secp256k1_modinv64_signed62 *)0x118c44;
        secp256k1_modinv64_update_de_62_cold_15();
        uVar5 = extraout_RAX_02;
        lVar12 = extraout_RDX_02;
LAB_00118c44:
        lVar14 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        lVar10 = lVar9 - lVar14;
        if ((SBORROW8(lVar9,lVar14) != SBORROW8(lVar10,(ulong)(uVar19 < -uVar5))) ==
            (long)(lVar10 - (ulong)(uVar19 < -uVar5)) < 0) goto LAB_00118ad7;
LAB_00118c66:
        psStack_b0 = (secp256k1_modinv64_signed62 *)0x118c6b;
        secp256k1_modinv64_update_de_62_cold_14();
        uVar5 = extraout_RAX_03;
        lVar12 = extraout_RDX_03;
LAB_00118c6b:
        uVar7 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        a_01 = (secp256k1_modinv64_signed62 *)
               ((uVar26 - uVar7) - (ulong)(psVar23 < (secp256k1_modinv64_signed62 *)-uVar5));
        if ((SBORROW8(uVar26,uVar7) !=
            SBORROW8(uVar26 - uVar7,(ulong)(psVar23 < (secp256k1_modinv64_signed62 *)-uVar5))) !=
            (long)a_01 < 0) goto LAB_00118c90;
LAB_00118b32:
        bVar27 = CARRY8((ulong)psVar23,uVar5);
        psVar23 = (secp256k1_modinv64_signed62 *)((long)psVar23->v + uVar5);
        uVar26 = uVar26 + lVar12 + (ulong)bVar27;
        uVar5 = lVar9 << 2 | uVar19 >> 0x3e;
        uVar7 = local_98 * local_78 + uVar5;
        a_01 = (secp256k1_modinv64_signed62 *)
               (SUB168(SEXT816((long)local_98) * SEXT816(local_78),8) + (lVar9 >> 0x3e) +
               (ulong)CARRY8(local_98 * local_78,uVar5));
        local_80->v[2] = uVar19 & 0x3fffffffffffffff;
        uVar5 = (long)local_90 * local_70;
        lVar12 = SUB168(SEXT816((long)local_90) * SEXT816(local_70),8);
        local_88->v[2] = (ulong)psVar23 & 0x3fffffffffffffff;
        if (lVar12 < 0) goto LAB_00118c95;
        uVar19 = -uVar5 - 1;
        lVar10 = (0x7fffffffffffffff - lVar12) - (long)a_01;
        lVar9 = lVar10 - (ulong)(uVar19 < uVar7);
        if ((SBORROW8(0x7fffffffffffffff - lVar12,(long)a_01) !=
            SBORROW8(lVar10,(ulong)(uVar19 < uVar7))) != lVar9 < 0) goto LAB_00118cb0;
LAB_00118ba4:
        uVar22 = (ulong)psVar23 >> 0x3e | uVar26 << 2;
        bVar27 = CARRY8(uVar7,uVar5);
        uVar7 = uVar7 + uVar5;
        a_01 = (secp256k1_modinv64_signed62 *)((long)a_01->v + (ulong)bVar27 + lVar12);
        uVar19 = local_a8 * local_78 + uVar22;
        lVar9 = SUB168(SEXT816((long)local_a8) * SEXT816(local_78),8) + ((long)uVar26 >> 0x3e) +
                (ulong)CARRY8(local_a8 * local_78,uVar22);
        uVar5 = (long)local_a0 * local_70;
        lVar12 = SUB168(SEXT816((long)local_a0) * SEXT816(local_70),8);
        if (lVar12 < 0) goto LAB_00118cb5;
        uVar22 = (ulong)(-uVar5 - 1 < uVar19);
        lVar10 = (0x7fffffffffffffff - lVar12) - lVar9;
        bVar27 = SBORROW8(0x7fffffffffffffff - lVar12,lVar9) != SBORROW8(lVar10,uVar22);
        lVar10 = lVar10 - uVar22;
      }
      unaff_R15 = local_68;
      psVar24 = local_88;
      if (bVar27 != lVar10 < 0) goto LAB_00118eb1;
      uVar22 = uVar19 + uVar5;
      lVar12 = lVar9 + lVar12 + (ulong)CARRY8(uVar19,uVar5);
      uVar19 = ((long)psVar11 >> 0x3f) << 8 | (ulong)psVar11 >> 0x38;
      uVar5 = (long)psVar11 * 0x100;
      if ((long)psVar11 < 0) {
        uVar26 = (long)psVar11 * -0x100;
        psVar11 = (secp256k1_modinv64_signed62 *)
                  ((-0x8000000000000000 - uVar19) - (ulong)(uVar5 != 0));
        uVar26 = (ulong)(uVar7 < uVar26);
        if ((SBORROW8((long)a_01,(long)psVar11) != SBORROW8((long)a_01 - (long)psVar11,uVar26)) !=
            (long)(((long)a_01 - (long)psVar11) - uVar26) < 0) goto LAB_00118e5f;
LAB_00118d18:
        bVar27 = CARRY8(uVar7,uVar5);
        uVar7 = uVar7 + uVar5;
        a_01 = (secp256k1_modinv64_signed62 *)((long)a_01->v + bVar27 + uVar19);
        unaff_R15 = (secp256k1_modinv64_signed62 *)((long)local_68 << 8 | uVar8 >> 0x38);
        uVar5 = uVar8 * 0x100;
        if ((long)uVar8 < 0) goto LAB_00118e64;
        uVar8 = uVar8 * -0x100 - 1;
        lVar10 = (0x7fffffffffffffff - (long)unaff_R15) - lVar12;
        a_00 = (secp256k1_modinv64_signed62 *)(lVar10 - (ulong)(uVar8 < uVar22));
        if ((SBORROW8(0x7fffffffffffffff - (long)unaff_R15,lVar12) !=
            SBORROW8(lVar10,(ulong)(uVar8 < uVar22))) != (long)a_00 < 0) goto LAB_00118e7f;
      }
      else {
        uVar26 = (ulong)((long)psVar11 * -0x100 - 1U < uVar7);
        lVar10 = (0x7fffffffffffffff - uVar19) - (long)a_01;
        psVar11 = (secp256k1_modinv64_signed62 *)(lVar10 - uVar26);
        if ((SBORROW8(0x7fffffffffffffff - uVar19,(long)a_01) != SBORROW8(lVar10,uVar26)) ==
            (long)psVar11 < 0) goto LAB_00118d18;
LAB_00118e5f:
        psStack_b0 = (secp256k1_modinv64_signed62 *)0x118e64;
        secp256k1_modinv64_update_de_62_cold_10();
        uVar5 = extraout_RAX_06;
LAB_00118e64:
        lVar9 = (-0x8000000000000000 - (long)unaff_R15) - (ulong)(uVar5 != 0);
        lVar10 = lVar12 - lVar9;
        uVar8 = lVar10 - (ulong)(uVar22 < -uVar5);
        if ((SBORROW8(lVar12,lVar9) != SBORROW8(lVar10,(ulong)(uVar22 < -uVar5))) != (long)uVar8 < 0
           ) {
LAB_00118e7f:
          psStack_b0 = (secp256k1_modinv64_signed62 *)0x118e84;
          secp256k1_modinv64_update_de_62_cold_9();
          goto LAB_00118e84;
        }
      }
      a_00 = local_80;
      lVar12 = (long)unaff_R15->v + (ulong)CARRY8(uVar22,uVar5) + lVar12;
      uVar19 = (long)a_01 << 2 | uVar7 >> 0x3e;
      local_80->v[3] = uVar7 & 0x3fffffffffffffff;
      psVar24->v[3] = uVar22 + uVar5 & 0x3fffffffffffffff;
      uVar8 = uVar19 + 0x8000000000000000;
      a_01 = (secp256k1_modinv64_signed62 *)
             (((long)a_01 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar19));
      if (a_01 != (secp256k1_modinv64_signed62 *)0xffffffffffffffff) goto LAB_00118eb6;
      uVar8 = 0xffffffffffffffff;
      uVar5 = uVar22 + uVar5 >> 0x3e | lVar12 * 4;
      local_80->v[4] = uVar19;
      if ((lVar12 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar5) != -1) goto LAB_00118ebb;
      psVar24->v[4] = uVar5;
      psVar11 = (secp256k1_modinv64_signed62 *)0x5;
      uVar8 = 0xfffffffffffffffe;
      psStack_b0 = (secp256k1_modinv64_signed62 *)0x118dc8;
      a_01 = local_80;
      iVar2 = secp256k1_modinv64_mul_cmp_62(local_80,5,&secp256k1_const_modinfo_fe.modulus,-2);
      if (iVar2 < 1) goto LAB_00118ec0;
      uVar8 = 1;
      psVar11 = (secp256k1_modinv64_signed62 *)0x5;
      psStack_b0 = (secp256k1_modinv64_signed62 *)0x118de9;
      a_01 = a_00;
      iVar2 = secp256k1_modinv64_mul_cmp_62(a_00,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (-1 < iVar2) goto LAB_00118ec5;
      psVar11 = (secp256k1_modinv64_signed62 *)0x5;
      uVar8 = 0xfffffffffffffffe;
      psStack_b0 = (secp256k1_modinv64_signed62 *)0x118e0c;
      a_01 = psVar24;
      iVar2 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,-2);
      if (iVar2 < 1) goto LAB_00118eca;
      uVar8 = 1;
      psVar11 = (secp256k1_modinv64_signed62 *)0x5;
      psStack_b0 = (secp256k1_modinv64_signed62 *)0x118e2d;
      a_01 = psVar24;
      iVar2 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_00118ecf;
    }
  }
  iVar2 = (int)psVar11;
  psStack_b0 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_21();
  psVar11 = &sStack_110;
  psStack_c0 = a_00;
  psStack_b8 = psVar24;
  psStack_b0 = unaff_R15;
  secp256k1_modinv64_mul_62(&sStack_e8,a_01,iVar2,1);
  psVar24 = a;
  secp256k1_modinv64_mul_62(&sStack_110,a,5,uVar8);
  lVar12 = 0;
  while ((ulong)sStack_e8.v[lVar12] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_110.v[lVar12]) goto LAB_00118f6e;
    lVar12 = lVar12 + 1;
    if (lVar12 == 4) {
      uVar3 = 4;
      while( true ) {
        if (sStack_e8.v[uVar3] < sStack_110.v[uVar3]) {
          return;
        }
        if (sStack_110.v[uVar3] < sStack_e8.v[uVar3]) break;
        bVar27 = uVar3 == 0;
        uVar3 = uVar3 - 1;
        if (bVar27) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00118f6e:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  lVar12 = psVar11->v[0];
  uVar8 = psVar11->v[1];
  uVar5 = psVar11->v[2];
  uVar7 = psVar11->v[3];
  lVar10 = psVar11->v[4];
  lVar9 = 0;
  do {
    if (psVar11->v[lVar9] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00119198:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0011919d;
    }
    if (0x3fffffffffffffff < psVar11->v[lVar9]) goto LAB_00119198;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 5);
  iVar2 = secp256k1_modinv64_mul_cmp_62(psVar11,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar2 < 1) {
LAB_0011919d:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_001191a2:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_001191a7:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar2 = secp256k1_modinv64_mul_cmp_62(psVar11,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar2) goto LAB_001191a2;
    uVar19 = lVar10 >> 0x3f;
    uVar25 = (long)psVar24 >> 0x3f;
    uVar22 = (lVar12 + (uVar19 & 0xfffffffefffffc2f) ^ uVar25) - uVar25;
    uVar26 = ((long)uVar22 >> 0x3e) + ((uVar8 ^ uVar25) - uVar25);
    uVar15 = ((long)uVar26 >> 0x3e) + ((uVar5 ^ uVar25) - uVar25);
    uVar18 = ((long)uVar15 >> 0x3e) + ((uVar7 ^ uVar25) - uVar25);
    lVar12 = ((long)uVar18 >> 0x3e) + (((uVar19 & 0x100) + lVar10 ^ uVar25) - uVar25);
    uVar7 = lVar12 >> 0x3f;
    uVar8 = (uVar7 & 0xfffffffefffffc2f) + (uVar22 & 0x3fffffffffffffff);
    uVar5 = ((long)uVar8 >> 0x3e) + (uVar26 & 0x3fffffffffffffff);
    uVar19 = ((long)uVar5 >> 0x3e) + (uVar15 & 0x3fffffffffffffff);
    uVar22 = ((long)uVar19 >> 0x3e) + (uVar18 & 0x3fffffffffffffff);
    uVar7 = ((long)uVar22 >> 0x3e) + (uVar7 & 0x100) + lVar12;
    psVar11->v[0] = uVar8 & 0x3fffffffffffffff;
    psVar11->v[1] = uVar5 & 0x3fffffffffffffff;
    psVar11->v[2] = uVar19 & 0x3fffffffffffffff;
    psVar11->v[3] = uVar22 & 0x3fffffffffffffff;
    psVar11->v[4] = uVar7;
    if (0x3fffffffffffffff < uVar7) goto LAB_001191a7;
    iVar2 = secp256k1_modinv64_mul_cmp_62(psVar11,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar2) {
      iVar2 = secp256k1_modinv64_mul_cmp_62(psVar11,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_001191b1;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_001191b1:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    secp256k1_int128 cd, ce;
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK(secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))); /* |q|+|r| <= 2^62 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    secp256k1_i128_mul(&cd, u, d0);
    secp256k1_i128_accum_mul(&cd, v, e0);
    secp256k1_i128_mul(&ce, q, d0);
    secp256k1_i128_accum_mul(&ce, r, e0);
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&cd) + md) & M62;
    me -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&ce) + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[0], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[0], me);
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cd) & M62) == 0); secp256k1_i128_rshift(&cd, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&ce) & M62) == 0); secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    secp256k1_i128_accum_mul(&cd, u, d1);
    secp256k1_i128_accum_mul(&cd, v, e1);
    secp256k1_i128_accum_mul(&ce, q, d1);
    secp256k1_i128_accum_mul(&ce, r, e1);
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[1], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[1], me);
    }
    d->v[0] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[0] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    secp256k1_i128_accum_mul(&cd, u, d2);
    secp256k1_i128_accum_mul(&cd, v, e2);
    secp256k1_i128_accum_mul(&ce, q, d2);
    secp256k1_i128_accum_mul(&ce, r, e2);
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[2], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[2], me);
    }
    d->v[1] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[1] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    secp256k1_i128_accum_mul(&cd, u, d3);
    secp256k1_i128_accum_mul(&cd, v, e3);
    secp256k1_i128_accum_mul(&ce, q, d3);
    secp256k1_i128_accum_mul(&ce, r, e3);
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[3], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[3], me);
    }
    d->v[2] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[2] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    secp256k1_i128_accum_mul(&cd, u, d4);
    secp256k1_i128_accum_mul(&cd, v, e4);
    secp256k1_i128_accum_mul(&ce, q, d4);
    secp256k1_i128_accum_mul(&ce, r, e4);
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[4], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[4], me);
    d->v[3] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[3] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = secp256k1_i128_to_i64(&cd);
    e->v[4] = secp256k1_i128_to_i64(&ce);

    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}